

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

double __thiscall
HighsSearch::checkSol
          (HighsSearch *this,vector<double,_std::allocator<double>_> *sol,bool *integerfeasible)

{
  HighsVarType HVar1;
  HighsInt HVar2;
  const_reference pvVar3;
  pointer pHVar4;
  byte *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  HighsInt i;
  HighsCDouble objval;
  undefined4 in_stack_ffffffffffffffa8;
  HighsInt in_stack_ffffffffffffffac;
  HighsMipSolver *in_stack_ffffffffffffffb0;
  value_type v;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  int local_2c;
  HighsCDouble local_28;
  byte *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  HighsCDouble::HighsCDouble(&local_28,0.0);
  *local_18 = 1;
  local_2c = 0;
  while (iVar6 = local_2c, HVar2 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI), iVar6 != HVar2
        ) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_2c);
    v = *pvVar3;
    HighsMipSolver::colCost(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    HighsCDouble::operator+=((HighsCDouble *)CONCAT44(iVar6,in_stack_ffffffffffffffc0),v);
    if (((*local_18 & 1) != 0) &&
       (HVar1 = HighsMipSolver::variableType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac),
       HVar1 == kInteger)) {
      std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_2c);
      in_stack_ffffffffffffffb0 =
           (HighsMipSolver *)
           fractionality<double>
                     ((double)in_stack_ffffffffffffffb0,
                      (double *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x68f198);
      if (pHVar4->feastol <= (double)in_stack_ffffffffffffffb0 &&
          (double)in_stack_ffffffffffffffb0 != pHVar4->feastol) {
        *local_18 = 0;
      }
    }
    local_2c = local_2c + 1;
  }
  dVar5 = HighsCDouble::operator_cast_to_double(&local_28);
  return dVar5;
}

Assistant:

double HighsSearch::checkSol(const std::vector<double>& sol,
                             bool& integerfeasible) const {
  HighsCDouble objval = 0.0;
  integerfeasible = true;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    objval += sol[i] * mipsolver.colCost(i);
    assert(std::isfinite(sol[i]));

    if (!integerfeasible || mipsolver.variableType(i) != HighsVarType::kInteger)
      continue;

    if (fractionality(sol[i]) > mipsolver.mipdata_->feastol) {
      integerfeasible = false;
    }
  }

  return double(objval);
}